

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>
Catch::Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>(void)

{
  undefined8 *puVar1;
  unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> uVar2;
  undefined8 *in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x118);
  *puVar1 = &PTR__CoutStream_001b1020;
  uVar2.m_ptr = (CoutStream *)
                std::ostream::ostream
                          (puVar1 + 1,
                           *(streambuf **)
                            (&__cxxabiv1::__function_type_info::vtable +
                            *(long *)(std::cout + -0x18)));
  *in_RDI = puVar1;
  return (unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>)uVar2.m_ptr;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }